

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O3

void __thiscall
duckdb::Prefix::Prefix(Prefix *this,ART *art,Node ptr_p,bool is_mutable,bool set_in_memory)

{
  _Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
  _Var1;
  bool bVar2;
  type paVar3;
  iterator iVar4;
  pointer pFVar5;
  data_ptr_t pdVar6;
  Node *pNVar7;
  undefined3 in_register_00000081;
  data_ptr_t pdVar8;
  ulong local_38;
  
  paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var1.super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
       paVar3->_M_elems[0].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>;
  local_38 = (ulong)ptr_p.super_IndexPointer.data & 0xffffffff;
  if (CONCAT31(in_register_00000081,set_in_memory) == 0) {
    iVar4 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)((long)_Var1.super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>.
                             _M_head_impl + 0x38),&local_38);
    pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar4.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    pdVar8 = FixedSizeBuffer::Get(pFVar5,is_mutable);
    pdVar8 = pdVar8 + *(long *)((long)_Var1.
                                      super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>.
                                      _M_head_impl + 0x20) +
                      (ulong)(ptr_p.super_IndexPointer.data._4_4_ & 0xffffff) *
                      *(long *)((long)_Var1.
                                      super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>.
                                      _M_head_impl + 0x10);
    this->data = pdVar8;
LAB_016ed9e6:
    pNVar7 = (Node *)(pdVar8 + (ulong)art->prefix_count + 1);
    bVar2 = true;
  }
  else {
    iVar4 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)((long)_Var1.super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>.
                             _M_head_impl + 0x38),&local_38);
    pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar4.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    bVar2 = BufferHandle::IsValid(&pFVar5->buffer_handle);
    if (bVar2) {
      pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)((long)iVar4.
                                      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                      ._M_cur + 0x10));
      pdVar6 = FixedSizeBuffer::Get(pFVar5,true);
      pdVar8 = pdVar6 + *(long *)((long)_Var1.
                                        super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>.
                                        _M_head_impl + 0x20) +
                        (ulong)(ptr_p.super_IndexPointer.data._4_4_ & 0xffffff) *
                        *(long *)((long)_Var1.
                                        super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>.
                                        _M_head_impl + 0x10);
      this->data = pdVar8;
      if (pdVar6 != (data_ptr_t)0x0) goto LAB_016ed9e6;
    }
    else {
      this->data = (data_ptr_t)0x0;
    }
    pNVar7 = (Node *)0x0;
    bVar2 = false;
  }
  this->ptr = pNVar7;
  this->in_memory = bVar2;
  return;
}

Assistant:

Prefix::Prefix(const ART &art, const Node ptr_p, const bool is_mutable, const bool set_in_memory) {
	if (!set_in_memory) {
		data = Node::GetAllocator(art, PREFIX).Get(ptr_p, is_mutable);
	} else {
		data = Node::GetAllocator(art, PREFIX).GetIfLoaded(ptr_p);
		if (!data) {
			ptr = nullptr;
			in_memory = false;
			return;
		}
	}
	ptr = reinterpret_cast<Node *>(data + Count(art) + 1);
	in_memory = true;
}